

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper
          (QSharedDataPointer<QHttpNetworkRequestPrivate> *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  QHttpNetworkRequestPrivate *this_00;
  
  this_00 = (QHttpNetworkRequestPrivate *)operator_new(0xd0);
  QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(this_00,(this->d).ptr);
  LOCK();
  (this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if (((__atomic_base<int>)
       *(__int_type *)
        &(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QHttpNetworkRequestPrivate *)0x0)) {
    QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate(pQVar1);
    operator_delete(pQVar1,0xd0);
  }
  (this->d).ptr = this_00;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}